

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

WeightParamType CoreML::valueType(WeightParams *param)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  WeightParamType WVar6;
  uint uVar7;
  
  iVar1 = (param->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(param->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar7 = (0 < iVar1) + 1;
  if (lVar2 == 0) {
    uVar7 = (uint)(0 < iVar1);
  }
  lVar3 = *(long *)(((ulong)(param->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(param->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar5 = (uint)(lVar4 == 0);
  uVar7 = (uVar7 - (lVar3 == 0)) + 2;
  WVar6 = UNSPECIFIED;
  if (uVar7 - uVar5 < 2) {
    WVar6 = EMPTY;
    if (uVar7 != uVar5) {
      WVar6 = (uint)(iVar1 < 1);
    }
    if (((((lVar2 == 0) && (uVar7 != uVar5)) && (iVar1 < 1)) &&
        (((lVar3 == 0 || (param == (WeightParams *)Specification::_WeightParams_default_instance_))
         || (WVar6 = QUINT, param->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar4 == 0 || (param == (WeightParams *)Specification::_WeightParams_default_instance_))
        || (WVar6 = QINT, param->quantization_ == (QuantizationParams *)0x0)))) {
      return EMPTY;
    }
  }
  return WVar6;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}